

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffsparser.h
# Opt level: O2

void std::
     __move_median_to_first<__gnu_cxx::__normal_iterator<REGION_INFO_*,std::vector<REGION_INFO_,std::allocator<REGION_INFO_>>>,__gnu_cxx::__ops::_Iter_less_iter>
               (REGION_INFO_ *__result,REGION_INFO_ *__a,REGION_INFO_ *__b,REGION_INFO_ *__c)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  REGION_INFO_ *__b_00;
  
  uVar1 = __a->offset;
  uVar2 = __b->offset;
  uVar3 = __c->offset;
  if (uVar1 < uVar2) {
    __b_00 = __b;
    if ((uVar3 <= uVar2) && (__b_00 = __a, uVar1 < uVar3)) {
      __b_00 = __c;
    }
  }
  else {
    __b_00 = __a;
    if ((uVar3 <= uVar1) && (__b_00 = __b, uVar2 < uVar3)) {
      __b_00 = __c;
    }
  }
  swap<REGION_INFO_>(__result,__b_00);
  return;
}

Assistant:

bool operator< (const struct REGION_INFO_ & lhs, const struct REGION_INFO_ & rhs) { return lhs.offset < rhs.offset; }